

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

opStatus __thiscall
llvm::APFloat::fusedMultiplyAdd(APFloat *this,APFloat *Multiplicand,APFloat *Addend,roundingMode RM)

{
  fltSemantics *pfVar1;
  opStatus oVar2;
  
  pfVar1 = (this->U).semantics;
  if (pfVar1 != (Multiplicand->U).semantics) {
    __assert_fail("&getSemantics() == &Multiplicand.getSemantics() && \"Should only call on APFloats with the same semantics\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                  ,0x3e6,
                  "opStatus llvm::APFloat::fusedMultiplyAdd(const APFloat &, const APFloat &, roundingMode)"
                 );
  }
  if (pfVar1 == (Addend->U).semantics) {
    if (pfVar1 != (fltSemantics *)semPPCDoubleDouble) {
      oVar2 = detail::IEEEFloat::fusedMultiplyAdd
                        (&(this->U).IEEE,&(Multiplicand->U).IEEE,&(Addend->U).IEEE,RM);
      return oVar2;
    }
    oVar2 = detail::DoubleAPFloat::fusedMultiplyAdd
                      ((DoubleAPFloat *)&(this->U).IEEE,(DoubleAPFloat *)&(Multiplicand->U).IEEE,
                       (DoubleAPFloat *)&(Addend->U).IEEE,RM);
    return oVar2;
  }
  __assert_fail("&getSemantics() == &Addend.getSemantics() && \"Should only call on APFloats with the same semantics\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                ,1000,
                "opStatus llvm::APFloat::fusedMultiplyAdd(const APFloat &, const APFloat &, roundingMode)"
               );
}

Assistant:

opStatus fusedMultiplyAdd(const APFloat &Multiplicand, const APFloat &Addend,
                            roundingMode RM) {
    assert(&getSemantics() == &Multiplicand.getSemantics() &&
           "Should only call on APFloats with the same semantics");
    assert(&getSemantics() == &Addend.getSemantics() &&
           "Should only call on APFloats with the same semantics");
    if (usesLayout<IEEEFloat>(getSemantics()))
      return U.IEEE.fusedMultiplyAdd(Multiplicand.U.IEEE, Addend.U.IEEE, RM);
    if (usesLayout<DoubleAPFloat>(getSemantics()))
      return U.Double.fusedMultiplyAdd(Multiplicand.U.Double, Addend.U.Double,
                                       RM);
    llvm_unreachable("Unexpected semantics");
  }